

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaLoader.cpp
# Opt level: O1

void __thiscall
Assimp::ColladaLoader::CreateAnimation
          (ColladaLoader *this,aiScene *pScene,ColladaParser *pParser,Animation *pSrcAnim,
          string *pName)

{
  pointer *pppaVar1;
  size_t *psVar2;
  undefined8 *puVar3;
  aiNode *paVar4;
  char *pcVar5;
  long lVar6;
  iterator __position;
  bool bVar7;
  undefined1 auVar8 [16];
  double dVar9;
  float fVar10;
  Accessor **ppAVar11;
  iterator iVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  aiMeshMorphAnim **__src;
  _Base_ptr __src_00;
  iterator iVar15;
  size_type sVar16;
  int iVar17;
  pointer ppaVar18;
  size_t sVar19;
  Node *pNVar20;
  long lVar21;
  Logger *pLVar22;
  pointer pTVar23;
  Accessor *pAVar24;
  Data *pDVar25;
  aiNodeAnim *paVar26;
  aiVectorKey *paVar27;
  aiQuatKey *paVar28;
  aiMeshMorphAnim *paVar29;
  pointer pCVar30;
  ulong *puVar31;
  uint *puVar32;
  double *pdVar33;
  aiAnimation *paVar34;
  aiNodeAnim **__dest;
  aiMeshMorphAnim **__dest_00;
  runtime_error *this_00;
  uint uVar35;
  aiQuatKey *paVar36;
  ulong uVar37;
  ulong uVar38;
  uint uVar39;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar40;
  char cVar41;
  uint uVar42;
  ColladaLoader *pCVar43;
  undefined1 auVar44 [8];
  size_t pos;
  ulong uVar45;
  string *psVar46;
  size_t sVar47;
  long lVar48;
  float fVar49;
  ai_real aVar50;
  ai_real aVar51;
  float fVar52;
  undefined4 uVar53;
  undefined4 uVar54;
  undefined4 uVar55;
  undefined4 uVar56;
  undefined4 uVar57;
  undefined4 uVar58;
  aiMeshMorphAnim *morphAnim;
  vector<Assimp::Collada::Transform,_std::allocator<Assimp::Collada::Transform>_> transforms;
  vector<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_> entries;
  vector<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_> resultTrafos;
  vector<aiMeshMorphAnim_*,_std::allocator<aiMeshMorphAnim_*>_> morphAnims;
  string subElement;
  vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_> anims;
  string targetID;
  string nodeName;
  vector<const_aiNode_*,_std::allocator<const_aiNode_*>_> nodes;
  aiMatrix4x4 mat;
  aiMeshMorphAnim *local_380;
  undefined1 local_378 [8];
  pointer pTStack_370;
  pointer local_368 [2];
  vector<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_> local_358;
  float local_33c;
  undefined1 local_338 [8];
  iterator iStack_330;
  _Alloc_hider local_328;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_320;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_310;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_300;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f0;
  Accessor *local_2e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_2d8;
  Data *pDStack_2c8;
  aiMeshMorphAnim **local_2b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_2b0;
  _Base_ptr local_298;
  _Base_ptr local_290;
  undefined1 local_288 [16];
  _Base_ptr local_278;
  iterator iStack_270;
  pointer local_268;
  Animation *local_260;
  ai_real local_254;
  _Rb_tree_node_base *local_250;
  pointer local_248;
  _Rb_tree_node_base local_240;
  AccessorLibrary *local_220;
  string local_218;
  vector<const_aiNode_*,_std::allocator<const_aiNode_*>_> local_1f8;
  string *local_1e0;
  ColladaLoader *local_1d8;
  pointer local_1d0;
  undefined1 local_1c8 [8];
  aiAnimation *paStack_1c0;
  pointer local_1b8;
  _Base_ptr p_Stack_1b0;
  _Base_ptr local_1a8;
  _Base_ptr p_Stack_1a0;
  size_t local_198;
  float fStack_190;
  float fStack_18c;
  ios_base local_158 [272];
  ai_real local_48;
  
  local_1f8.super__Vector_base<const_aiNode_*,_std::allocator<const_aiNode_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1f8.super__Vector_base<const_aiNode_*,_std::allocator<const_aiNode_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1f8.super__Vector_base<const_aiNode_*,_std::allocator<const_aiNode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_260 = pSrcAnim;
  local_1e0 = pName;
  CollectNodes(this,pScene->mRootNode,&local_1f8);
  local_278 = (_Base_ptr)0x0;
  iStack_270._M_current = (aiNodeAnim **)0x0;
  local_268 = (pointer)0x0;
  aStack_2b0._8_8_ = (aiMeshMorphAnim **)0x0;
  local_2b8 = (aiMeshMorphAnim **)0x0;
  aStack_2b0._M_allocated_capacity = 0;
  if (local_1f8.super__Vector_base<const_aiNode_*,_std::allocator<const_aiNode_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_1f8.super__Vector_base<const_aiNode_*,_std::allocator<const_aiNode_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_220 = &pParser->mAccessorLibrary;
    local_240._M_right = (_Base_ptr)&pParser->mDataLibrary;
    ppaVar18 = local_1f8.super__Vector_base<const_aiNode_*,_std::allocator<const_aiNode_*>_>._M_impl
               .super__Vector_impl_data._M_start;
    local_240._M_left = (_Base_ptr)pParser;
    local_1d8 = this;
    do {
      local_358.
      super__Vector_base<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_358.
      super__Vector_base<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_358.
      super__Vector_base<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      paVar4 = *ppaVar18;
      pcVar5 = (paVar4->mName).data;
      local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
      local_1d0 = ppaVar18;
      sVar19 = strlen(pcVar5);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_218,pcVar5,(paVar4->mName).data + sVar19);
      pNVar20 = FindNode(this,pParser->mRootNode,&local_218);
      if (pNVar20 != (Node *)0x0) {
        local_250 = &local_240;
        local_248 = (pointer)0x0;
        local_240._M_color._0_1_ = _S_red;
        local_298 = (_Base_ptr)local_288;
        local_290 = (_Base_ptr)0x0;
        local_288[0] = _S_red;
        for (paVar40 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)(local_260->mChannels).
                          super__Vector_base<Assimp::Collada::AnimationChannel,_std::allocator<Assimp::Collada::AnimationChannel>_>
                          ._M_impl.super__Vector_impl_data._M_start;
            paVar40 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_260->mChannels).
               super__Vector_base<Assimp::Collada::AnimationChannel,_std::allocator<Assimp::Collada::AnimationChannel>_>
               ._M_impl.super__Vector_impl_data._M_finish; paVar40 = paVar40 + 0xc) {
          local_338 = (undefined1  [8])0x0;
          iStack_330._M_current = (aiMatrix4x4t<float> *)&local_320;
          local_328._M_p = (pointer)0x0;
          local_320._M_local_buf[0] = '\0';
          local_310._M_allocated_capacity = (size_type)&local_300;
          local_310._8_8_ = (char *)0x0;
          local_300._M_local_buf[0] = '\0';
          aStack_2d8._8_8_ = 0;
          pDStack_2c8 = (Data *)0x0;
          local_2e0 = (Accessor *)0x0;
          aStack_2d8._M_allocated_capacity = 0;
          local_2f0._M_allocated_capacity = 0;
          local_2f0._8_8_ = 0;
          cVar41 = (char)paVar40;
          lVar21 = std::__cxx11::string::find(cVar41,0x2f);
          if (lVar21 == -1) {
            lVar21 = std::__cxx11::string::find
                               (paVar40->_M_local_buf,(ulong)(pNVar20->mID)._M_dataplus._M_p,0);
            if (lVar21 != -1) {
              local_338 = (undefined1  [8])paVar40;
              std::__cxx11::string::substr((ulong)local_1c8,(ulong)paVar40);
              std::__cxx11::string::operator=((string *)&iStack_330,(string *)local_1c8);
              if (local_1c8 != (undefined1  [8])&local_1b8) {
                operator_delete((void *)local_1c8);
              }
              if (*(char *)iStack_330._M_current == '-') {
                std::__cxx11::string::substr((ulong)local_1c8,(ulong)&iStack_330);
                std::__cxx11::string::operator=((string *)&iStack_330,(string *)local_1c8);
                if (local_1c8 != (undefined1  [8])&local_1b8) {
                  operator_delete((void *)local_1c8);
                }
              }
              std::
              vector<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
              ::push_back(&local_358,(value_type *)local_338);
            }
          }
          else {
            lVar21 = std::__cxx11::string::find(cVar41,0x2f);
            if (lVar21 == -1) {
              local_248 = (pointer)0x0;
              *(undefined1 *)&local_250->_M_color = _S_red;
              std::__cxx11::string::substr((ulong)local_1c8,(ulong)paVar40);
              std::__cxx11::string::operator=((string *)&local_250,(string *)local_1c8);
              if (local_1c8 != (undefined1  [8])&local_1b8) {
                operator_delete((void *)local_1c8);
              }
              if ((local_248 == (pointer)(pNVar20->mID)._M_string_length) &&
                 ((local_248 == (pointer)0x0 ||
                  (iVar17 = bcmp(local_250,(pNVar20->mID)._M_dataplus._M_p,(size_t)local_248),
                  iVar17 == 0)))) {
                lVar21 = std::__cxx11::string::find(cVar41,0x2e);
                if (lVar21 == -1) {
                  std::__cxx11::string::substr((ulong)local_1c8,(ulong)paVar40);
                  std::__cxx11::string::operator=
                            ((string *)local_310._M_local_buf,(string *)local_1c8);
                  if (local_1c8 != (undefined1  [8])&local_1b8) {
                    operator_delete((void *)local_1c8);
                  }
                }
                else {
                  lVar21 = std::__cxx11::string::find(cVar41,0x2e);
                  if (lVar21 != -1) goto LAB_0040f8a6;
                  std::__cxx11::string::substr((ulong)local_1c8,(ulong)paVar40);
                  std::__cxx11::string::operator=
                            ((string *)local_310._M_local_buf,(string *)local_1c8);
                  if (local_1c8 != (undefined1  [8])&local_1b8) {
                    operator_delete((void *)local_1c8);
                  }
                  local_290 = (_Base_ptr)0x0;
                  *(undefined1 *)&local_298->_M_color = _S_red;
                  std::__cxx11::string::substr((ulong)local_1c8,(ulong)paVar40);
                  std::__cxx11::string::operator=((string *)&local_298,(string *)local_1c8);
                  if (local_1c8 != (undefined1  [8])&local_1b8) {
                    operator_delete((void *)local_1c8);
                  }
                  iVar17 = std::__cxx11::string::compare((char *)&local_298);
                  if (iVar17 == 0) {
                    local_2f0._8_8_ = 3;
                  }
                  else {
                    iVar17 = std::__cxx11::string::compare((char *)&local_298);
                    if (iVar17 == 0) {
                      local_2f0._8_8_ = 0;
                    }
                    else {
                      iVar17 = std::__cxx11::string::compare((char *)&local_298);
                      if (iVar17 == 0) {
                        local_2f0._8_8_ = 1;
                      }
                      else {
                        iVar17 = std::__cxx11::string::compare((char *)&local_298);
                        if (iVar17 == 0) {
                          local_2f0._8_8_ = 2;
                        }
                        else {
                          pLVar22 = DefaultLogger::get();
                          Formatter::
                          basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
                          basic_formatter<char[26]>
                                    ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_1c8,(char (*) [26])"Unknown anim subelement <");
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_1c8,(char *)local_298,(long)local_290);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_1c8,">. Ignoring",0xb);
                          std::__cxx11::stringbuf::str();
                          Logger::warn(pLVar22,(char *)local_378);
                          if (local_378 != (undefined1  [8])local_368) {
                            operator_delete((void *)local_378);
                          }
                          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
                          std::ios_base::~ios_base(local_158);
                        }
                      }
                    }
                  }
                }
                lVar21 = std::__cxx11::string::find(cVar41,0x28);
                if (lVar21 != -1) {
                  std::__cxx11::string::substr((ulong)local_1c8,(ulong)paVar40);
                  std::__cxx11::string::operator=
                            ((string *)local_310._M_local_buf,(string *)local_1c8);
                  if (local_1c8 != (undefined1  [8])&local_1b8) {
                    operator_delete((void *)local_1c8);
                  }
                  local_290 = (_Base_ptr)0x0;
                  *(undefined1 *)&local_298->_M_color = _S_red;
                  std::__cxx11::string::substr((ulong)local_1c8,(ulong)paVar40);
                  std::__cxx11::string::operator=((string *)&local_298,(string *)local_1c8);
                  if (local_1c8 != (undefined1  [8])&local_1b8) {
                    operator_delete((void *)local_1c8);
                  }
                  iVar17 = std::__cxx11::string::compare((char *)&local_298);
                  if (iVar17 == 0) {
                    local_2f0._8_8_ = 0;
                  }
                  else {
                    iVar17 = std::__cxx11::string::compare((char *)&local_298);
                    if (iVar17 == 0) {
                      local_2f0._8_8_ = 1;
                    }
                    else {
                      iVar17 = std::__cxx11::string::compare((char *)&local_298);
                      if (iVar17 == 0) {
                        local_2f0._8_8_ = 2;
                      }
                      else {
                        iVar17 = std::__cxx11::string::compare((char *)&local_298);
                        if (iVar17 == 0) {
                          local_2f0._8_8_ = 3;
                        }
                        else {
                          iVar17 = std::__cxx11::string::compare((char *)&local_298);
                          if (iVar17 == 0) {
                            local_2f0._8_8_ = 4;
                          }
                          else {
                            iVar17 = std::__cxx11::string::compare((char *)&local_298);
                            if (iVar17 == 0) {
                              local_2f0._8_8_ = 5;
                            }
                            else {
                              iVar17 = std::__cxx11::string::compare((char *)&local_298);
                              if (iVar17 == 0) {
                                local_2f0._8_8_ = 6;
                              }
                              else {
                                iVar17 = std::__cxx11::string::compare((char *)&local_298);
                                if (iVar17 == 0) {
                                  local_2f0._8_8_ = 7;
                                }
                                else {
                                  iVar17 = std::__cxx11::string::compare((char *)&local_298);
                                  if (iVar17 == 0) {
                                    local_2f0._8_8_ = 8;
                                  }
                                  else {
                                    iVar17 = std::__cxx11::string::compare((char *)&local_298);
                                    if (iVar17 == 0) {
                                      local_2f0._8_8_ = 9;
                                    }
                                    else {
                                      iVar17 = std::__cxx11::string::compare((char *)&local_298);
                                      if (iVar17 == 0) {
                                        local_2f0._8_8_ = 10;
                                      }
                                      else {
                                        iVar17 = std::__cxx11::string::compare((char *)&local_298);
                                        if (iVar17 == 0) {
                                          local_2f0._8_8_ = 0xb;
                                        }
                                        else {
                                          iVar17 = std::__cxx11::string::compare((char *)&local_298)
                                          ;
                                          if (iVar17 == 0) {
                                            local_2f0._8_8_ = 0xc;
                                          }
                                          else {
                                            iVar17 = std::__cxx11::string::compare
                                                               ((char *)&local_298);
                                            if (iVar17 == 0) {
                                              local_2f0._8_8_ = 0xd;
                                            }
                                            else {
                                              iVar17 = std::__cxx11::string::compare
                                                                 ((char *)&local_298);
                                              if (iVar17 == 0) {
                                                local_2f0._8_8_ = 0xe;
                                              }
                                              else {
                                                iVar17 = std::__cxx11::string::compare
                                                                   ((char *)&local_298);
                                                if (iVar17 == 0) {
                                                  local_2f0._8_8_ = 0xf;
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
                uVar14 = local_310._8_8_;
                uVar13 = local_310._M_allocated_capacity;
                local_2f0._M_allocated_capacity = 0xffffffffffffffff;
                pTVar23 = (pNVar20->mTransforms).
                          super__Vector_base<Assimp::Collada::Transform,_std::allocator<Assimp::Collada::Transform>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                if ((pNVar20->mTransforms).
                    super__Vector_base<Assimp::Collada::Transform,_std::allocator<Assimp::Collada::Transform>_>
                    ._M_impl.super__Vector_impl_data._M_finish != pTVar23) {
                  lVar21 = 8;
                  uVar38 = 0;
                  do {
                    pcVar5 = *(char **)((long)pTVar23->f + lVar21 + -0x24);
                    if ((pcVar5 == (char *)uVar14) &&
                       ((pcVar5 == (char *)0x0 ||
                        (iVar17 = bcmp(*(void **)((long)pTVar23->f + lVar21 + -0x2c),(void *)uVar13,
                                       (size_t)pcVar5), iVar17 == 0)))) {
                      local_2f0._M_allocated_capacity = uVar38;
                    }
                    uVar38 = uVar38 + 1;
                    pTVar23 = (pNVar20->mTransforms).
                              super__Vector_base<Assimp::Collada::Transform,_std::allocator<Assimp::Collada::Transform>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                    lVar21 = lVar21 + 0x68;
                  } while (uVar38 < (ulong)(((long)(pNVar20->mTransforms).
                                                                                                      
                                                  super__Vector_base<Assimp::Collada::Transform,_std::allocator<Assimp::Collada::Transform>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                             (long)pTVar23 >> 3) * 0x4ec4ec4ec4ec4ec5));
                }
                if (local_2f0._M_allocated_capacity == 0xffffffffffffffff) {
                  lVar21 = std::__cxx11::string::find(local_310._M_local_buf,0x729991,0);
                  if (lVar21 == -1) goto LAB_0040f8a6;
                  std::__cxx11::string::_M_assign((string *)&iStack_330);
                  std::__cxx11::string::_M_replace
                            ((ulong)&local_310,0,(char *)local_310._8_8_,0x736f2f);
                }
                local_338 = (undefined1  [8])paVar40;
                std::
                vector<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
                ::push_back(&local_358,(value_type *)local_338);
              }
            }
          }
LAB_0040f8a6:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_310._M_allocated_capacity != &local_300) {
            operator_delete((void *)local_310._M_allocated_capacity);
          }
          pParser = (ColladaParser *)local_240._M_left;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)iStack_330._M_current != &local_320) {
            operator_delete(iStack_330._M_current);
          }
        }
        if (local_358.
            super__Vector_base<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_358.
            super__Vector_base<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          fVar10 = 1e+20;
          if (local_358.
              super__Vector_base<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              local_358.
              super__Vector_base<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            fVar10 = 1e+20;
            pCVar30 = local_358.
                      super__Vector_base<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            do {
              pAVar24 = ColladaParser::ResolveLibraryReference<Assimp::Collada::Accessor>
                                  (pParser,local_220,&pCVar30->mChannel->mSourceTimes);
              pCVar30->mTimeAccessor = pAVar24;
              pDVar25 = ColladaParser::ResolveLibraryReference<Assimp::Collada::Data>
                                  (pParser,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Data,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Data>_>_>
                                            *)local_240._M_right,&pAVar24->mSource);
              pCVar30->mTimeData = pDVar25;
              pAVar24 = ColladaParser::ResolveLibraryReference<Assimp::Collada::Accessor>
                                  (pParser,local_220,&pCVar30->mChannel->mSourceValues);
              pCVar30->mValueAccessor = pAVar24;
              pDVar25 = ColladaParser::ResolveLibraryReference<Assimp::Collada::Data>
                                  (pParser,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Data,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Data>_>_>
                                            *)local_240._M_right,&pAVar24->mSource);
              pCVar30->mValueData = pDVar25;
              pAVar24 = pCVar30->mTimeAccessor;
              sVar47 = pAVar24->mCount;
              if (sVar47 != pCVar30->mValueAccessor->mCount) {
LAB_00410d95:
                this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1c8,
                           "Time count / value count mismatch in animation channel \"",0x38);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1c8,(pCVar30->mChannel->mTarget)._M_dataplus._M_p,
                           (pCVar30->mChannel->mTarget)._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"\".",2);
                std::__cxx11::stringbuf::str();
                std::runtime_error::runtime_error(this_00,(string *)local_338);
                *(undefined ***)this_00 = &PTR__runtime_error_00896c98;
                __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error)
                ;
              }
              if (sVar47 != 0) {
                pDVar25 = pCVar30->mTimeData;
                pCVar43 = (ColladaLoader *)
                          (pDVar25->mValues).super__Vector_base<float,_std::allocator<float>_>.
                          _M_impl.super__Vector_impl_data._M_start;
                if ((ulong)((long)(pDVar25->mValues).
                                  super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                  super__Vector_impl_data._M_finish - (long)pCVar43 >> 2) <=
                    pAVar24->mOffset) {
                  __assert_fail("pos < pData.mValues.size()",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Collada/ColladaLoader.cpp"
                                ,0x74a,
                                "ai_real Assimp::ColladaLoader::ReadFloat(const Collada::Accessor &, const Collada::Data &, size_t, size_t) const"
                               );
                }
                fVar49 = *(float *)((long)&(pCVar43->super_BaseImporter)._vptr_BaseImporter +
                                   pAVar24->mOffset * 4);
                if (fVar10 <= fVar49) {
                  fVar49 = fVar10;
                }
                ReadFloat(pCVar43,pAVar24,pDVar25,sVar47 - 1,0);
                fVar10 = fVar49;
              }
              pCVar30 = pCVar30 + 1;
            } while (pCVar30 !=
                     local_358.
                     super__Vector_base<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
          }
          local_338 = (undefined1  [8])0x0;
          iStack_330._M_current = (aiMatrix4x4t<float> *)0x0;
          local_328._M_p = (pointer)0x0;
          if ((local_358.
               super__Vector_base<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
               ._M_impl.super__Vector_impl_data._M_start !=
               local_358.
               super__Vector_base<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
               ._M_impl.super__Vector_impl_data._M_finish) &&
             ((local_358.
               super__Vector_base<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
               ._M_impl.super__Vector_impl_data._M_start)->mTimeAccessor->mCount != 0)) {
            pCVar43 = (ColladaLoader *)local_378;
            std::vector<Assimp::Collada::Transform,_std::allocator<Assimp::Collada::Transform>_>::
            vector((vector<Assimp::Collada::Transform,_std::allocator<Assimp::Collada::Transform>_>
                    *)pCVar43,&pNVar20->mTransforms);
            pCVar30 = local_358.
                      super__Vector_base<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            do {
              for (; pCVar30 !=
                     local_358.
                     super__Vector_base<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
                     ._M_impl.super__Vector_impl_data._M_finish; pCVar30 = pCVar30 + 1) {
                pAVar24 = pCVar30->mTimeAccessor;
                if (pAVar24->mCount == 0) {
                  fVar49 = 0.0;
                  uVar38 = 0;
                }
                else {
                  uVar38 = 0;
                  do {
                    fVar49 = ReadFloat(pCVar43,pAVar24,pCVar30->mTimeData,uVar38,0);
                    if (fVar10 <= fVar49) break;
                    uVar38 = uVar38 + 1;
                    pAVar24 = pCVar30->mTimeAccessor;
                  } while (uVar38 < pAVar24->mCount);
                }
                uVar45 = pCVar30->mTimeAccessor->mCount - 1;
                if (uVar38 <= uVar45) {
                  uVar45 = uVar38;
                }
                pAVar24 = pCVar30->mValueAccessor;
                if (pAVar24->mSize != 0) {
                  sVar47 = 0;
                  do {
                    aVar50 = ReadFloat(pCVar43,pAVar24,pCVar30->mValueData,uVar45,sVar47);
                    *(ai_real *)(local_1c8 + sVar47 * 4) = aVar50;
                    sVar47 = sVar47 + 1;
                    pAVar24 = pCVar30->mValueAccessor;
                  } while (sVar47 < pAVar24->mSize);
                }
                if ((fVar10 < fVar49) && (uVar45 != 0)) {
                  aVar50 = ReadFloat(pCVar43,pCVar30->mTimeAccessor,pCVar30->mTimeData,uVar45 - 1,0)
                  ;
                  pAVar24 = pCVar30->mValueAccessor;
                  if (pAVar24->mSize != 0) {
                    sVar47 = 0;
                    do {
                      aVar51 = ReadFloat(pCVar43,pAVar24,pCVar30->mValueData,uVar45 - 1,sVar47);
                      *(float *)(local_1c8 + sVar47 * 4) =
                           (aVar51 - *(float *)(local_1c8 + sVar47 * 4)) *
                           ((fVar10 - fVar49) / (aVar50 - fVar49)) +
                           *(float *)(local_1c8 + sVar47 * 4);
                      sVar47 = sVar47 + 1;
                      pAVar24 = pCVar30->mValueAccessor;
                    } while (sVar47 < pAVar24->mSize);
                  }
                }
                sVar47 = pCVar30->mValueAccessor->mSize;
                if (sVar47 != 0) {
                  pCVar43 = (ColladaLoader *)
                            (((aiString *)local_378)->data +
                            pCVar30->mSubElement * 4 + pCVar30->mTransformIndex * 0x68 + 0x20);
                  memcpy(pCVar43,local_1c8,sVar47 << 2);
                }
              }
              pCVar43 = (ColladaLoader *)local_1c8;
              ColladaParser::CalculateResultTransform
                        ((aiMatrix4x4 *)pCVar43,pParser,
                         (vector<Assimp::Collada::Transform,_std::allocator<Assimp::Collada::Transform>_>
                          *)local_378);
              fStack_18c = fVar10;
              if (iStack_330._M_current == (aiMatrix4x4t<float> *)local_328._M_p) {
                pCVar43 = (ColladaLoader *)local_338;
                std::vector<aiMatrix4x4t<float>,std::allocator<aiMatrix4x4t<float>>>::
                _M_realloc_insert<aiMatrix4x4t<float>const&>
                          ((vector<aiMatrix4x4t<float>,std::allocator<aiMatrix4x4t<float>>> *)
                           pCVar43,iStack_330,(aiMatrix4x4t<float> *)local_1c8);
              }
              else {
                (iStack_330._M_current)->d1 = (float)(undefined4)local_198;
                (iStack_330._M_current)->d2 = (float)local_198._4_4_;
                *(undefined8 *)&(iStack_330._M_current)->d3 = _fStack_190;
                *(_Base_ptr *)&(iStack_330._M_current)->c1 = local_1a8;
                *(_Base_ptr *)&(iStack_330._M_current)->c3 = p_Stack_1a0;
                *(pointer *)&(iStack_330._M_current)->b1 = local_1b8;
                *(_Base_ptr *)&(iStack_330._M_current)->b3 = p_Stack_1b0;
                (iStack_330._M_current)->a1 = (float)local_1c8._0_4_;
                (iStack_330._M_current)->a2 = (float)local_1c8._4_4_;
                *(aiAnimation **)&(iStack_330._M_current)->a3 = paStack_1c0;
                iStack_330._M_current = iStack_330._M_current + 1;
              }
              fVar49 = 1e+20;
              if (local_358.
                  super__Vector_base<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
                  ._M_impl.super__Vector_impl_data._M_start !=
                  local_358.
                  super__Vector_base<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
                fVar49 = 1e+20;
                pCVar30 = local_358.
                          super__Vector_base<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                do {
                  uVar38 = 0;
                  do {
                    aVar50 = fVar49;
                    if (pCVar30->mTimeAccessor->mCount <= uVar38) break;
                    aVar51 = ReadFloat(pCVar43,pCVar30->mTimeAccessor,pCVar30->mTimeData,uVar38,0);
                    if (fVar10 < aVar51) {
                      aVar50 = aVar51;
                      if (fVar49 <= aVar51) {
                        aVar50 = fVar49;
                      }
                    }
                    else {
                      uVar38 = uVar38 + 1;
                    }
                    fVar49 = aVar50;
                  } while (aVar51 <= fVar10);
                  fVar49 = aVar50;
                  if ((((*(int *)(((aiString *)local_378)->data +
                                 pCVar30->mTransformIndex * 0x68 + 0x1c) == 1) && (uVar38 != 0)) &&
                      (pCVar30->mSubElement == 3)) && (uVar38 < pCVar30->mTimeAccessor->mCount)) {
                    local_48 = ReadFloat(pCVar43,pCVar30->mValueAccessor,pCVar30->mValueData,uVar38,
                                         0);
                    local_254 = ReadFloat(pCVar43,pCVar30->mValueAccessor,pCVar30->mValueData,
                                          uVar38 - 1,0);
                    local_33c = ReadFloat(pCVar43,pCVar30->mTimeAccessor,pCVar30->mTimeData,uVar38,0
                                         );
                    aVar51 = ReadFloat(pCVar43,pCVar30->mTimeAccessor,pCVar30->mTimeData,uVar38 - 1,
                                       0);
                    fVar52 = ABS(local_48 -
                                 (((fVar10 - aVar51) * (local_48 - local_254)) /
                                  (local_33c - aVar51) + local_254));
                    if (180.0 <= fVar52) {
                      if ((local_33c != fVar10) || (NAN(local_33c) || NAN(fVar10))) {
                        dVar9 = floor((double)fVar52 / 90.0);
                        fVar49 = (local_33c - fVar10) / (float)(int)dVar9 + fVar10;
                        if (aVar50 <= fVar49) {
                          fVar49 = aVar50;
                        }
                      }
                    }
                  }
                  pCVar30 = pCVar30 + 1;
                } while (pCVar30 !=
                         local_358.
                         super__Vector_base<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
              }
              pCVar30 = local_358.
                        super__Vector_base<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              fVar10 = fVar49;
            } while (fVar49 <= 1e+19);
            std::vector<Assimp::Collada::Transform,_std::allocator<Assimp::Collada::Transform>_>::
            ~vector((vector<Assimp::Collada::Transform,_std::allocator<Assimp::Collada::Transform>_>
                     *)local_378);
          }
          iVar12._M_current = iStack_330._M_current;
          auVar44 = local_338;
          if (local_338 == (undefined1  [8])iStack_330._M_current) {
            pLVar22 = DefaultLogger::get();
            Logger::warn(pLVar22,
                         "Collada loader: found empty animation channel, ignored. Please check your exporter."
                        );
          }
          else {
            paVar26 = (aiNodeAnim *)operator_new(0x438);
            (paVar26->mNodeName).length = 0;
            (paVar26->mNodeName).data[0] = '\0';
            memset((paVar26->mNodeName).data + 1,0x1b,0x3ff);
            sVar16 = local_218._M_string_length;
            paVar26->mRotationKeys = (aiQuatKey *)0x0;
            paVar26->mNumScalingKeys = 0;
            *(undefined8 *)&paVar26->mNumPositionKeys = 0;
            *(undefined8 *)((long)&paVar26->mPositionKeys + 4) = 0;
            paVar26->mScalingKeys = (aiVectorKey *)0x0;
            paVar26->mPreState = aiAnimBehaviour_DEFAULT;
            paVar26->mPostState = aiAnimBehaviour_DEFAULT;
            local_378 = (undefined1  [8])paVar26;
            if (local_218._M_string_length < (pointer)0x400) {
              (paVar26->mNodeName).length = (ai_uint32)local_218._M_string_length;
              memcpy((paVar26->mNodeName).data,local_218._M_dataplus._M_p,local_218._M_string_length
                    );
              (paVar26->mNodeName).data[sVar16] = '\0';
            }
            uVar45 = (long)iVar12._M_current - (long)auVar44 >> 6;
            uVar39 = (uint)uVar45;
            paVar26->mNumPositionKeys = uVar39;
            paVar26->mNumRotationKeys = uVar39;
            auVar8._8_8_ = 0;
            auVar8._0_8_ = uVar45;
            uVar38 = SUB168(auVar8 * ZEXT816(0x18),0);
            paVar26->mNumScalingKeys = uVar39;
            if (SUB168(auVar8 * ZEXT816(0x18),8) != 0) {
              uVar38 = 0xffffffffffffffff;
            }
            paVar27 = (aiVectorKey *)operator_new__(uVar38);
            if ((undefined1  [8])iVar12._M_current != auVar44) {
              lVar21 = 0;
              do {
                puVar3 = (undefined8 *)((long)&paVar27->mTime + lVar21);
                *puVar3 = 0;
                puVar3[1] = 0;
                *(undefined4 *)((long)&(paVar27->mValue).z + lVar21) = 0;
                lVar21 = lVar21 + 0x18;
              } while (uVar45 * 0x18 != lVar21);
            }
            paVar26->mPositionKeys = paVar27;
            paVar28 = (aiQuatKey *)operator_new__(uVar38);
            if ((undefined1  [8])iVar12._M_current != auVar44) {
              paVar36 = paVar28;
              do {
                paVar36->mTime = 0.0;
                (paVar36->mValue).w = 1.0;
                (paVar36->mValue).x = 0.0;
                (paVar36->mValue).y = 0.0;
                (paVar36->mValue).z = 0.0;
                paVar36 = paVar36 + 1;
              } while (paVar36 != paVar28 + uVar45);
            }
            paVar26->mRotationKeys = paVar28;
            paVar27 = (aiVectorKey *)operator_new__(uVar38);
            if ((undefined1  [8])iVar12._M_current != auVar44) {
              lVar21 = 0;
              do {
                puVar3 = (undefined8 *)((long)&paVar27->mTime + lVar21);
                *puVar3 = 0;
                puVar3[1] = 0;
                *(undefined4 *)((long)&(paVar27->mValue).z + lVar21) = 0;
                lVar21 = lVar21 + 0x18;
              } while (uVar45 * 0x18 != lVar21);
            }
            paVar26->mScalingKeys = paVar27;
            if ((undefined1  [8])iStack_330._M_current != local_338) {
              lVar21 = 8;
              lVar48 = 0;
              uVar38 = 0;
              do {
                local_1c8 = *(undefined1 (*) [8])((long)local_338 + lVar48);
                paStack_1c0 = *(aiAnimation **)((char *)((long)local_338 + lVar48) + 8);
                local_1b8 = *(pointer *)((long)local_338 + lVar48 + 0x10);
                p_Stack_1b0 = *(_Base_ptr *)((char *)((long)local_338 + lVar48 + 0x10) + 8);
                local_1a8 = *(_Base_ptr *)((long)local_338 + lVar48 + 0x20);
                p_Stack_1a0 = *(_Base_ptr *)((char *)((long)local_338 + lVar48 + 0x20) + 8);
                psVar2 = (size_t *)((long)local_338 + lVar48 + 0x30);
                local_198 = *psVar2;
                sVar47 = psVar2[1];
                fStack_18c = (float)(sVar47 >> 0x20);
                dVar9 = (double)fStack_18c;
                fStack_190 = (float)sVar47;
                fStack_18c = 1.0;
                *(double *)((long)*(aiVectorKey **)((long)local_378 + 0x408) + lVar21 + -8) = dVar9;
                *(double *)((long)*(aiQuatKey **)((long)local_378 + 0x418) + lVar21 + -8) = dVar9;
                *(double *)((long)*(aiVectorKey **)((long)local_378 + 0x428) + lVar21 + -8) = dVar9;
                aiMatrix4x4t<float>::Decompose
                          ((aiMatrix4x4t<float> *)local_1c8,
                           (aiVector3t<float> *)
                           ((long)&(*(aiVectorKey **)((long)local_378 + 0x428))->mTime + lVar21),
                           (aiQuaterniont<float> *)
                           ((long)&(*(aiQuatKey **)((long)local_378 + 0x418))->mTime + lVar21),
                           (aiVector3t<float> *)
                           ((long)&(*(aiVectorKey **)((long)local_378 + 0x408))->mTime + lVar21));
                uVar38 = uVar38 + 1;
                lVar21 = lVar21 + 0x18;
                lVar48 = lVar48 + 0x40;
              } while (uVar38 < (ulong)((long)iStack_330._M_current - (long)local_338 >> 6));
            }
            if ((pointer)iStack_270._M_current == local_268) {
              std::vector<aiNodeAnim*,std::allocator<aiNodeAnim*>>::
              _M_realloc_insert<aiNodeAnim*const&>
                        ((vector<aiNodeAnim*,std::allocator<aiNodeAnim*>> *)&local_278,iStack_270,
                         (aiNodeAnim **)local_378);
              pParser = (ColladaParser *)local_240._M_left;
            }
            else {
              *iStack_270._M_current = (aiNodeAnim *)local_378;
              iStack_270._M_current = iStack_270._M_current + 1;
              pParser = (ColladaParser *)local_240._M_left;
            }
          }
          if ((local_358.
               super__Vector_base<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
               ._M_impl.super__Vector_impl_data._M_start !=
               local_358.
               super__Vector_base<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
               ._M_impl.super__Vector_impl_data._M_finish) &&
             ((local_358.
               super__Vector_base<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
               ._M_impl.super__Vector_impl_data._M_start)->mTimeAccessor->mCount != 0)) {
            local_1c8 = (undefined1  [8])0x0;
            paStack_1c0 = (aiAnimation *)0x0;
            local_1b8 = (pointer)0x0;
            if (local_358.
                super__Vector_base<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
                ._M_impl.super__Vector_impl_data._M_start !=
                local_358.
                super__Vector_base<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              psVar46 = &(local_358.
                          super__Vector_base<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
                          ._M_impl.super__Vector_impl_data._M_start)->mTargetId;
              do {
                if ((psVar46->_M_string_length != 0) &&
                   (lVar21 = std::__cxx11::string::find((char *)psVar46,0x729991,0), lVar21 != -1))
                {
                  std::
                  vector<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
                  ::push_back((vector<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
                               *)local_1c8,(value_type *)((long)(psVar46 + -1) + 0x18));
                }
                ppAVar11 = (Accessor **)(psVar46 + 3);
                psVar46 = (string *)((long)(psVar46 + 3) + 0x18);
              } while ((pointer)(ppAVar11 + 2) !=
                       local_358.
                       super__Vector_base<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
            }
            auVar44 = local_1c8;
            if ((undefined1  [8])paStack_1c0 != local_1c8) {
              paVar29 = (aiMeshMorphAnim *)operator_new(0x410);
              (paVar29->mName).length = 0;
              (paVar29->mName).data[0] = '\0';
              memset((paVar29->mName).data + 1,0x1b,0x3ff);
              sVar16 = local_218._M_string_length;
              paVar29->mNumKeys = 0;
              paVar29->mKeys = (aiMeshMorphKey *)0x0;
              local_380 = paVar29;
              if (local_218._M_string_length < (pointer)0x400) {
                (paVar29->mName).length = (ai_uint32)local_218._M_string_length;
                memcpy((paVar29->mName).data,local_218._M_dataplus._M_p,local_218._M_string_length);
                (paVar29->mName).data[sVar16] = '\0';
              }
              local_378 = (undefined1  [8])0x0;
              pTStack_370 = (pointer)0x0;
              local_368[0] = (pointer)0x0;
              if (auVar44 != (undefined1  [8])paStack_1c0) {
                uVar39 = 0;
                do {
                  cVar41 = SUB81(auVar44,0) + '\b';
                  pCVar30 = (pointer)std::__cxx11::string::find(cVar41,0x28);
                  lVar21 = std::__cxx11::string::find(cVar41,0x29);
                  if ((pCVar30 != (pointer)0xffffffffffffffff) && (lVar21 != -1)) {
                    lVar21 = *(long *)((((aiAnimation *)auVar44)->mName).data + 0x5c);
                    lVar48 = *(long *)(lVar21 + 8);
                    if (*(long *)(lVar21 + 0x10) != lVar48) {
                      uVar38 = 0;
                      uVar45 = 1;
                      do {
                        lVar21 = *(long *)((((aiAnimation *)auVar44)->mName).data + 0x6c);
                        lVar6 = *(long *)(lVar21 + 8);
                        if ((ulong)(*(long *)(lVar21 + 0x10) - lVar6 >> 2) <= uVar38) {
                          std::__throw_out_of_range_fmt
                                    (
                                    "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                    );
                          goto LAB_00410d95;
                        }
                        insertMorphTimeValue
                                  ((vector<Assimp::MorphTimeValues,_std::allocator<Assimp::MorphTimeValues>_>
                                    *)local_378,*(float *)(lVar48 + uVar38 * 4),
                                   *(float *)(lVar6 + uVar38 * 4),uVar39);
                        lVar21 = *(long *)((((aiAnimation *)auVar44)->mName).data + 0x5c);
                        lVar48 = *(long *)(lVar21 + 8);
                        bVar7 = uVar45 < (ulong)(*(long *)(lVar21 + 0x10) - lVar48 >> 2);
                        uVar38 = uVar45;
                        uVar45 = (ulong)((int)uVar45 + 1);
                      } while (bVar7);
                    }
                    uVar39 = uVar39 + 1;
                  }
                  auVar44 = (undefined1  [8])((((aiAnimation *)auVar44)->mName).data + 0x74);
                } while (auVar44 != (undefined1  [8])paStack_1c0);
              }
              paVar29 = local_380;
              uVar38 = (long)pTStack_370 - (long)local_378 >> 5;
              local_380->mNumKeys = (uint)uVar38;
              uVar38 = uVar38 & 0xffffffff;
              puVar31 = (ulong *)operator_new__(uVar38 * 0x20 + 8);
              *puVar31 = uVar38;
              if (uVar38 != 0) {
                lVar21 = 0;
                do {
                  puVar3 = (undefined8 *)((long)puVar31 + lVar21 + 0x14);
                  *puVar3 = 0;
                  puVar3[1] = 0;
                  puVar3 = (undefined8 *)((long)&((aiMeshMorphKey *)(puVar31 + 1))->mTime + lVar21);
                  *puVar3 = 0;
                  puVar3[1] = 0;
                  lVar21 = lVar21 + 0x20;
                } while (uVar38 * 0x20 != lVar21);
              }
              paVar29->mKeys = (aiMeshMorphKey *)(puVar31 + 1);
              if (local_380->mNumKeys != 0) {
                uVar39 = 0;
                do {
                  uVar45 = (ulong)uVar39;
                  local_380->mKeys[uVar45].mNumValuesAndWeights =
                       (int)((ulong)((long)paStack_1c0 - (long)local_1c8) >> 3) * -0x11111111;
                  lVar21 = (long)paStack_1c0 - (long)local_1c8 >> 3;
                  puVar32 = (uint *)operator_new__(-(ulong)((ulong)(lVar21 * -0x1111111111111111) >>
                                                            0x3e != 0) |
                                                   lVar21 * -0x4444444444444444);
                  local_380->mKeys[uVar45].mValues = puVar32;
                  lVar21 = (long)paStack_1c0 - (long)local_1c8 >> 3;
                  uVar38 = lVar21 * 0x7777777777777778;
                  if (0x1fffffffffffffff < (ulong)(lVar21 * -0x1111111111111111)) {
                    uVar38 = 0xffffffffffffffff;
                  }
                  pdVar33 = (double *)operator_new__(uVar38);
                  local_380->mKeys[uVar45].mWeights = pdVar33;
                  local_380->mKeys[uVar45].mTime =
                       (double)*(float *)(((aiString *)local_378)->data + uVar45 * 0x20 + -4);
                  if ((undefined1  [8])paStack_1c0 != local_1c8) {
                    uVar38 = 0;
                    do {
                      uVar35 = (uint)uVar38;
                      local_380->mKeys[uVar45].mValues[uVar38] = uVar35;
                      lVar21 = *(long *)(((aiString *)local_378)->data +
                                        (long)(int)uVar39 * 0x20 + 4);
                      lVar48 = *(long *)(((aiString *)local_378)->data +
                                        (long)(int)uVar39 * 0x20 + 0xc) - lVar21;
                      dVar9 = 0.0;
                      if (lVar48 != 0) {
                        uVar42 = 1;
                        uVar37 = 0;
                        do {
                          if (*(uint *)(lVar21 + 4 + uVar37 * 8) == uVar35) {
                            dVar9 = (double)*(float *)(lVar21 + uVar37 * 8);
                            break;
                          }
                          uVar37 = (ulong)uVar42;
                          uVar42 = uVar42 + 1;
                          dVar9 = 0.0;
                        } while (uVar37 < (ulong)(lVar48 >> 3));
                      }
                      local_380->mKeys[uVar45].mWeights[uVar38] = dVar9;
                      uVar38 = (ulong)(uVar35 + 1);
                      uVar37 = ((long)paStack_1c0 - (long)local_1c8 >> 3) * -0x1111111111111111;
                    } while (uVar38 <= uVar37 && uVar37 - uVar38 != 0);
                  }
                  uVar39 = uVar39 + 1;
                } while (uVar39 < local_380->mNumKeys);
              }
              if (aStack_2b0._M_allocated_capacity == aStack_2b0._8_8_) {
                std::vector<aiMeshMorphAnim*,std::allocator<aiMeshMorphAnim*>>::
                _M_realloc_insert<aiMeshMorphAnim*const&>
                          ((vector<aiMeshMorphAnim*,std::allocator<aiMeshMorphAnim*>> *)&local_2b8,
                           (iterator)aStack_2b0._M_allocated_capacity,&local_380);
              }
              else {
                *(aiMeshMorphAnim **)aStack_2b0._M_allocated_capacity = local_380;
                aStack_2b0._M_allocated_capacity = aStack_2b0._M_allocated_capacity + 8;
              }
              std::vector<Assimp::MorphTimeValues,_std::allocator<Assimp::MorphTimeValues>_>::
              ~vector((vector<Assimp::MorphTimeValues,_std::allocator<Assimp::MorphTimeValues>_> *)
                      local_378);
            }
            std::
            vector<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>::
            ~vector((vector<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
                     *)local_1c8);
          }
          if (local_338 != (undefined1  [8])0x0) {
            operator_delete((void *)local_338);
          }
        }
        if (local_298 != (_Base_ptr)local_288) {
          operator_delete(local_298);
        }
        this = local_1d8;
        if (local_250 != &local_240) {
          operator_delete(local_250);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        operator_delete(local_218._M_dataplus._M_p);
      }
      std::vector<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>::
      ~vector(&local_358);
      ppaVar18 = local_1d0 + 1;
    } while (ppaVar18 !=
             local_1f8.super__Vector_base<const_aiNode_*,_std::allocator<const_aiNode_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  iVar15._M_current = iStack_270._M_current;
  __src_00 = local_278;
  if ((local_278 != (_Base_ptr)iStack_270._M_current) ||
     (local_2b8 != (aiMeshMorphAnim **)aStack_2b0._M_allocated_capacity)) {
    paVar34 = (aiAnimation *)operator_new(0x448);
    (paVar34->mName).length = 0;
    (paVar34->mName).data[0] = '\0';
    memset((paVar34->mName).data + 1,0x1b,0x3ff);
    paVar34->mDuration = -1.0;
    paVar34->mTicksPerSecond = 0.0;
    paVar34->mNumChannels = 0;
    paVar34->mChannels = (aiNodeAnim **)0x0;
    paVar34->mNumMeshChannels = 0;
    paVar34->mMeshChannels = (aiMeshAnim **)0x0;
    paVar34->mNumMorphMeshChannels = 0;
    paVar34->mMorphMeshChannels = (aiMeshMorphAnim **)0x0;
    uVar38 = local_1e0->_M_string_length;
    local_1c8 = (undefined1  [8])paVar34;
    if (uVar38 < 0x400) {
      (paVar34->mName).length = (ai_uint32)uVar38;
      memcpy((paVar34->mName).data,(local_1e0->_M_dataplus)._M_p,uVar38);
      (paVar34->mName).data[uVar38] = '\0';
    }
    sVar19 = (long)iVar15._M_current - (long)__src_00;
    uVar39 = (uint)((long)sVar19 >> 3);
    paVar34->mNumChannels = uVar39;
    if (uVar39 != 0) {
      uVar38 = 0xffffffffffffffff;
      if ((ulong)((long)sVar19 >> 3) < 0x2000000000000000) {
        uVar38 = sVar19;
      }
      __dest = (aiNodeAnim **)operator_new__(uVar38);
      paVar34->mChannels = __dest;
      if (__src_00 != (_Base_ptr)iVar15._M_current) {
        memmove(__dest,__src_00,sVar19);
      }
    }
    auVar44 = local_1c8;
    uVar13 = aStack_2b0._M_allocated_capacity;
    __src = local_2b8;
    uVar38 = aStack_2b0._M_allocated_capacity - (long)local_2b8;
    uVar39 = (uint)(uVar38 >> 3);
    *(uint *)((long)local_1c8 + 0x438) = uVar39;
    if (uVar39 != 0) {
      __dest_00 = (aiMeshMorphAnim **)operator_new__(uVar38 & 0x7fffffff8);
      *(aiMeshMorphAnim ***)((long)auVar44 + 0x440) = __dest_00;
      if ((aiMeshMorphAnim **)uVar13 != __src) {
        memmove(__dest_00,__src,uVar38);
      }
    }
    *(double *)((long)local_1c8 + 0x408) = 0.0;
    if ((long)iStack_270._M_current - (long)local_278 != 0) {
      lVar21 = (long)iStack_270._M_current - (long)local_278 >> 3;
      uVar53 = SUB84(*(double *)((long)local_1c8 + 0x408),0);
      uVar54 = (undefined4)((ulong)*(double *)((long)local_1c8 + 0x408) >> 0x20);
      lVar48 = 0;
      do {
        dVar9 = *(double *)
                 (*(long *)(*(long *)(&local_278->_M_color + lVar48 * 2) + 0x408) +
                 (ulong)(*(int *)(*(long *)(&local_278->_M_color + lVar48 * 2) + 0x404) - 1) * 0x18)
        ;
        uVar55 = SUB84(dVar9,0);
        uVar56 = (int)((ulong)dVar9 >> 0x20);
        if (dVar9 <= (double)CONCAT44(uVar54,uVar53)) {
          uVar55 = uVar53;
          uVar56 = uVar54;
        }
        *(ulong *)((long)local_1c8 + 0x408) = CONCAT44(uVar56,uVar55);
        dVar9 = *(double *)
                 (*(long *)(*(long *)(&local_278->_M_color + lVar48 * 2) + 0x418) +
                 (ulong)(*(int *)(*(long *)(&local_278->_M_color + lVar48 * 2) + 0x410) - 1) * 0x18)
        ;
        uVar57 = SUB84(dVar9,0);
        uVar58 = (int)((ulong)dVar9 >> 0x20);
        if (dVar9 <= (double)CONCAT44(uVar56,uVar55)) {
          uVar57 = uVar55;
          uVar58 = uVar56;
        }
        *(ulong *)((long)local_1c8 + 0x408) = CONCAT44(uVar58,uVar57);
        dVar9 = *(double *)
                 (*(long *)(*(long *)(&local_278->_M_color + lVar48 * 2) + 0x428) +
                 (ulong)(*(int *)(*(long *)(&local_278->_M_color + lVar48 * 2) + 0x420) - 1) * 0x18)
        ;
        uVar53 = SUB84(dVar9,0);
        uVar54 = (int)((ulong)dVar9 >> 0x20);
        if (dVar9 <= (double)CONCAT44(uVar58,uVar57)) {
          uVar53 = uVar57;
          uVar54 = uVar58;
        }
        *(ulong *)((long)local_1c8 + 0x408) = CONCAT44(uVar54,uVar53);
        lVar48 = lVar48 + 1;
      } while (lVar21 + (ulong)(lVar21 == 0) != lVar48);
    }
    if (aStack_2b0._M_allocated_capacity - (long)local_2b8 != 0) {
      lVar21 = (long)(aStack_2b0._M_allocated_capacity - (long)local_2b8) >> 3;
      uVar53 = SUB84(*(double *)((long)local_1c8 + 0x408),0);
      uVar54 = (undefined4)((ulong)*(double *)((long)local_1c8 + 0x408) >> 0x20);
      lVar48 = 0;
      do {
        dVar9 = local_2b8[lVar48]->mKeys[local_2b8[lVar48]->mNumKeys - 1].mTime;
        uVar55 = SUB84(dVar9,0);
        uVar56 = (int)((ulong)dVar9 >> 0x20);
        if (dVar9 <= (double)CONCAT44(uVar54,uVar53)) {
          uVar55 = uVar53;
          uVar56 = uVar54;
        }
        uVar54 = uVar56;
        uVar53 = uVar55;
        *(ulong *)((long)local_1c8 + 0x408) = CONCAT44(uVar54,uVar53);
        lVar48 = lVar48 + 1;
      } while (lVar21 + (ulong)(lVar21 == 0) != lVar48);
    }
    *(double *)((long)local_1c8 + 0x410) = 1.0;
    __position._M_current =
         (this->mAnims).super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->mAnims).super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiAnimation*,std::allocator<aiAnimation*>>::_M_realloc_insert<aiAnimation*const&>
                ((vector<aiAnimation*,std::allocator<aiAnimation*>> *)&this->mAnims,__position,
                 (aiAnimation **)local_1c8);
    }
    else {
      *__position._M_current = (aiAnimation *)local_1c8;
      pppaVar1 = &(this->mAnims).super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      *pppaVar1 = *pppaVar1 + 1;
    }
  }
  if (local_2b8 != (aiMeshMorphAnim **)0x0) {
    operator_delete(local_2b8);
  }
  if (local_278 != (_Base_ptr)0x0) {
    operator_delete(local_278);
  }
  if (local_1f8.super__Vector_base<const_aiNode_*,_std::allocator<const_aiNode_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1f8.super__Vector_base<const_aiNode_*,_std::allocator<const_aiNode_*>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void ColladaLoader::CreateAnimation(aiScene* pScene, const ColladaParser& pParser, const Collada::Animation* pSrcAnim, const std::string& pName)
{
    // collect a list of animatable nodes
    std::vector<const aiNode*> nodes;
    CollectNodes(pScene->mRootNode, nodes);

    std::vector<aiNodeAnim*> anims;
    std::vector<aiMeshMorphAnim*> morphAnims;

    for (std::vector<const aiNode*>::const_iterator nit = nodes.begin(); nit != nodes.end(); ++nit)
    {
        // find all the collada anim channels which refer to the current node
        std::vector<Collada::ChannelEntry> entries;
        std::string nodeName = (*nit)->mName.data;

        // find the collada node corresponding to the aiNode
        const Collada::Node* srcNode = FindNode(pParser.mRootNode, nodeName);
        //      ai_assert( srcNode != NULL);
        if (!srcNode)
            continue;

        // now check all channels if they affect the current node
        std::string targetID, subElement;
        for (std::vector<Collada::AnimationChannel>::const_iterator cit = pSrcAnim->mChannels.begin();
            cit != pSrcAnim->mChannels.end(); ++cit)
        {
            const Collada::AnimationChannel& srcChannel = *cit;
            Collada::ChannelEntry entry;

            // we expect the animation target to be of type "nodeName/transformID.subElement". Ignore all others
            // find the slash that separates the node name - there should be only one
            std::string::size_type slashPos = srcChannel.mTarget.find('/');
            if (slashPos == std::string::npos)
            {
                std::string::size_type targetPos = srcChannel.mTarget.find(srcNode->mID);
                if (targetPos == std::string::npos)
                    continue;

                // not node transform, but something else. store as unknown animation channel for now
                entry.mChannel = &(*cit);
                entry.mTargetId = srcChannel.mTarget.substr(targetPos + pSrcAnim->mName.length(),
                    srcChannel.mTarget.length() - targetPos - pSrcAnim->mName.length());
                if (entry.mTargetId.front() == '-')
                    entry.mTargetId = entry.mTargetId.substr(1);
                entries.push_back(entry);
                continue;
            }
            if (srcChannel.mTarget.find('/', slashPos + 1) != std::string::npos)
                continue;

            targetID.clear();
            targetID = srcChannel.mTarget.substr(0, slashPos);
            if (targetID != srcNode->mID)
                continue;

            // find the dot that separates the transformID - there should be only one or zero
            std::string::size_type dotPos = srcChannel.mTarget.find('.');
            if (dotPos != std::string::npos)
            {
                if (srcChannel.mTarget.find('.', dotPos + 1) != std::string::npos)
                    continue;

                entry.mTransformId = srcChannel.mTarget.substr(slashPos + 1, dotPos - slashPos - 1);

                subElement.clear();
                subElement = srcChannel.mTarget.substr(dotPos + 1);
                if (subElement == "ANGLE")
                    entry.mSubElement = 3; // last number in an Axis-Angle-Transform is the angle
                else if (subElement == "X")
                    entry.mSubElement = 0;
                else if (subElement == "Y")
                    entry.mSubElement = 1;
                else if (subElement == "Z")
                    entry.mSubElement = 2;
                else
                    ASSIMP_LOG_WARN_F("Unknown anim subelement <", subElement, ">. Ignoring");
            }
            else {
                // no subelement following, transformId is remaining string
                entry.mTransformId = srcChannel.mTarget.substr(slashPos + 1);
            }

            std::string::size_type bracketPos = srcChannel.mTarget.find('(');
            if (bracketPos != std::string::npos)
            {
                entry.mTransformId = srcChannel.mTarget.substr(slashPos + 1, bracketPos - slashPos - 1);
                subElement.clear();
                subElement = srcChannel.mTarget.substr(bracketPos);

                if (subElement == "(0)(0)")
                    entry.mSubElement = 0;
                else if (subElement == "(1)(0)")
                    entry.mSubElement = 1;
                else if (subElement == "(2)(0)")
                    entry.mSubElement = 2;
                else if (subElement == "(3)(0)")
                    entry.mSubElement = 3;
                else if (subElement == "(0)(1)")
                    entry.mSubElement = 4;
                else if (subElement == "(1)(1)")
                    entry.mSubElement = 5;
                else if (subElement == "(2)(1)")
                    entry.mSubElement = 6;
                else if (subElement == "(3)(1)")
                    entry.mSubElement = 7;
                else if (subElement == "(0)(2)")
                    entry.mSubElement = 8;
                else if (subElement == "(1)(2)")
                    entry.mSubElement = 9;
                else if (subElement == "(2)(2)")
                    entry.mSubElement = 10;
                else if (subElement == "(3)(2)")
                    entry.mSubElement = 11;
                else if (subElement == "(0)(3)")
                    entry.mSubElement = 12;
                else if (subElement == "(1)(3)")
                    entry.mSubElement = 13;
                else if (subElement == "(2)(3)")
                    entry.mSubElement = 14;
                else if (subElement == "(3)(3)")
                    entry.mSubElement = 15;
            }

            // determine which transform step is affected by this channel
            entry.mTransformIndex = SIZE_MAX;
            for (size_t a = 0; a < srcNode->mTransforms.size(); ++a)
                if (srcNode->mTransforms[a].mID == entry.mTransformId)
                    entry.mTransformIndex = a;

            if (entry.mTransformIndex == SIZE_MAX)
            {
                if (entry.mTransformId.find("morph-weights") != std::string::npos)
                {
                    entry.mTargetId = entry.mTransformId;
                    entry.mTransformId = "";
                }
                else
                    continue;
            }

            entry.mChannel = &(*cit);
            entries.push_back(entry);
        }

        // if there's no channel affecting the current node, we skip it
        if (entries.empty())
            continue;

        // resolve the data pointers for all anim channels. Find the minimum time while we're at it
        ai_real startTime = ai_real(1e20), endTime = ai_real(-1e20);
        for (std::vector<Collada::ChannelEntry>::iterator it = entries.begin(); it != entries.end(); ++it)
        {
            Collada::ChannelEntry& e = *it;
            e.mTimeAccessor = &pParser.ResolveLibraryReference(pParser.mAccessorLibrary, e.mChannel->mSourceTimes);
            e.mTimeData = &pParser.ResolveLibraryReference(pParser.mDataLibrary, e.mTimeAccessor->mSource);
            e.mValueAccessor = &pParser.ResolveLibraryReference(pParser.mAccessorLibrary, e.mChannel->mSourceValues);
            e.mValueData = &pParser.ResolveLibraryReference(pParser.mDataLibrary, e.mValueAccessor->mSource);

            // time count and value count must match
            if (e.mTimeAccessor->mCount != e.mValueAccessor->mCount)
                throw DeadlyImportError(format() << "Time count / value count mismatch in animation channel \"" << e.mChannel->mTarget << "\".");

            if (e.mTimeAccessor->mCount > 0)
            {
                // find bounding times
                startTime = std::min(startTime, ReadFloat(*e.mTimeAccessor, *e.mTimeData, 0, 0));
                endTime = std::max(endTime, ReadFloat(*e.mTimeAccessor, *e.mTimeData, e.mTimeAccessor->mCount - 1, 0));
            }
        }

        std::vector<aiMatrix4x4> resultTrafos;
        if (!entries.empty() && entries.front().mTimeAccessor->mCount > 0)
        {
            // create a local transformation chain of the node's transforms
            std::vector<Collada::Transform> transforms = srcNode->mTransforms;

            // now for every unique point in time, find or interpolate the key values for that time
            // and apply them to the transform chain. Then the node's present transformation can be calculated.
            ai_real time = startTime;
            while (1)
            {
                for (std::vector<Collada::ChannelEntry>::iterator it = entries.begin(); it != entries.end(); ++it)
                {
                    Collada::ChannelEntry& e = *it;

                    // find the keyframe behind the current point in time
                    size_t pos = 0;
                    ai_real postTime = 0.0;
                    while (1)
                    {
                        if (pos >= e.mTimeAccessor->mCount)
                            break;
                        postTime = ReadFloat(*e.mTimeAccessor, *e.mTimeData, pos, 0);
                        if (postTime >= time)
                            break;
                        ++pos;
                    }

                    pos = std::min(pos, e.mTimeAccessor->mCount - 1);

                    // read values from there
                    ai_real temp[16];
                    for (size_t c = 0; c < e.mValueAccessor->mSize; ++c)
                        temp[c] = ReadFloat(*e.mValueAccessor, *e.mValueData, pos, c);

                    // if not exactly at the key time, interpolate with previous value set
                    if (postTime > time && pos > 0)
                    {
                        ai_real preTime = ReadFloat(*e.mTimeAccessor, *e.mTimeData, pos - 1, 0);
                        ai_real factor = (time - postTime) / (preTime - postTime);

                        for (size_t c = 0; c < e.mValueAccessor->mSize; ++c)
                        {
                            ai_real v = ReadFloat(*e.mValueAccessor, *e.mValueData, pos - 1, c);
                            temp[c] += (v - temp[c]) * factor;
                        }
                    }

                    // Apply values to current transformation
                    std::copy(temp, temp + e.mValueAccessor->mSize, transforms[e.mTransformIndex].f + e.mSubElement);
                }

                // Calculate resulting transformation
                aiMatrix4x4 mat = pParser.CalculateResultTransform(transforms);

                // out of laziness: we store the time in matrix.d4
                mat.d4 = time;
                resultTrafos.push_back(mat);

                // find next point in time to evaluate. That's the closest frame larger than the current in any channel
                ai_real nextTime = ai_real(1e20);
                for (std::vector<Collada::ChannelEntry>::iterator it = entries.begin(); it != entries.end(); ++it)
                {
                    Collada::ChannelEntry& channelElement = *it;

                    // find the next time value larger than the current
                    size_t pos = 0;
                    while (pos < channelElement.mTimeAccessor->mCount)
                    {
                        const ai_real t = ReadFloat(*channelElement.mTimeAccessor, *channelElement.mTimeData, pos, 0);
                        if (t > time)
                        {
                            nextTime = std::min(nextTime, t);
                            break;
                        }
                        ++pos;
                    }

                    // https://github.com/assimp/assimp/issues/458
                    // Sub-sample axis-angle channels if the delta between two consecutive
                    // key-frame angles is >= 180 degrees.
                    if (transforms[channelElement.mTransformIndex].mType == Collada::TF_ROTATE && channelElement.mSubElement == 3 && pos > 0 && pos < channelElement.mTimeAccessor->mCount) {
                        const ai_real cur_key_angle = ReadFloat(*channelElement.mValueAccessor, *channelElement.mValueData, pos, 0);
                        const ai_real last_key_angle = ReadFloat(*channelElement.mValueAccessor, *channelElement.mValueData, pos - 1, 0);
                        const ai_real cur_key_time = ReadFloat(*channelElement.mTimeAccessor, *channelElement.mTimeData, pos, 0);
                        const ai_real last_key_time = ReadFloat(*channelElement.mTimeAccessor, *channelElement.mTimeData, pos - 1, 0);
                        const ai_real last_eval_angle = last_key_angle + (cur_key_angle - last_key_angle) * (time - last_key_time) / (cur_key_time - last_key_time);
                        const ai_real delta = std::abs(cur_key_angle - last_eval_angle);
                        if (delta >= 180.0) {
                            const int subSampleCount = static_cast<int>(std::floor(delta / 90.0));
                            if (cur_key_time != time) {
                                const ai_real nextSampleTime = time + (cur_key_time - time) / subSampleCount;
                                nextTime = std::min(nextTime, nextSampleTime);
                            }
                        }
                    }
                }

                // no more keys on any channel after the current time -> we're done
                if (nextTime > 1e19)
                    break;

                // else construct next keyframe at this following time point
                time = nextTime;
            }
        }

        // there should be some keyframes, but we aren't that fixated on valid input data
//      ai_assert( resultTrafos.size() > 0);

        // build an animation channel for the given node out of these trafo keys
        if (!resultTrafos.empty())
        {
            aiNodeAnim* dstAnim = new aiNodeAnim;
            dstAnim->mNodeName = nodeName;
            dstAnim->mNumPositionKeys = static_cast<unsigned int>(resultTrafos.size());
            dstAnim->mNumRotationKeys = static_cast<unsigned int>(resultTrafos.size());
            dstAnim->mNumScalingKeys = static_cast<unsigned int>(resultTrafos.size());
            dstAnim->mPositionKeys = new aiVectorKey[resultTrafos.size()];
            dstAnim->mRotationKeys = new aiQuatKey[resultTrafos.size()];
            dstAnim->mScalingKeys = new aiVectorKey[resultTrafos.size()];

            for (size_t a = 0; a < resultTrafos.size(); ++a)
            {
                aiMatrix4x4 mat = resultTrafos[a];
                double time = double(mat.d4); // remember? time is stored in mat.d4
                mat.d4 = 1.0f;

                dstAnim->mPositionKeys[a].mTime = time;
                dstAnim->mRotationKeys[a].mTime = time;
                dstAnim->mScalingKeys[a].mTime = time;
                mat.Decompose(dstAnim->mScalingKeys[a].mValue, dstAnim->mRotationKeys[a].mValue, dstAnim->mPositionKeys[a].mValue);
            }

            anims.push_back(dstAnim);
        }
        else
        {
            ASSIMP_LOG_WARN("Collada loader: found empty animation channel, ignored. Please check your exporter.");
        }

        if (!entries.empty() && entries.front().mTimeAccessor->mCount > 0)
        {
            std::vector<Collada::ChannelEntry> morphChannels;
            for (std::vector<Collada::ChannelEntry>::iterator it = entries.begin(); it != entries.end(); ++it)
            {
                Collada::ChannelEntry& e = *it;

                // skip non-transform types
                if (e.mTargetId.empty())
                    continue;

                if (e.mTargetId.find("morph-weights") != std::string::npos)
                    morphChannels.push_back(e);
            }
            if (morphChannels.size() > 0)
            {
                // either 1) morph weight animation count should contain morph target count channels
                // or     2) one channel with morph target count arrays
                // assume first

                aiMeshMorphAnim *morphAnim = new aiMeshMorphAnim;
                morphAnim->mName.Set(nodeName);

                std::vector<MorphTimeValues> morphTimeValues;

                int morphAnimChannelIndex = 0;
                for (std::vector<Collada::ChannelEntry>::iterator it = morphChannels.begin(); it != morphChannels.end(); ++it)
                {
                    Collada::ChannelEntry& e = *it;
                    std::string::size_type apos = e.mTargetId.find('(');
                    std::string::size_type bpos = e.mTargetId.find(')');
                    if (apos == std::string::npos || bpos == std::string::npos)
                        // unknown way to specify weight -> ignore this animation
                        continue;

                    // weight target can be in format Weight_M_N, Weight_N, WeightN, or some other way
                    // we ignore the name and just assume the channels are in the right order
                    for (unsigned int i = 0; i < e.mTimeData->mValues.size(); i++)
                        insertMorphTimeValue(morphTimeValues, e.mTimeData->mValues.at(i), e.mValueData->mValues.at(i), morphAnimChannelIndex);

                    ++morphAnimChannelIndex;
                }

                morphAnim->mNumKeys = static_cast<unsigned int>(morphTimeValues.size());
                morphAnim->mKeys = new aiMeshMorphKey[morphAnim->mNumKeys];
                for (unsigned int key = 0; key < morphAnim->mNumKeys; key++)
                {
                    morphAnim->mKeys[key].mNumValuesAndWeights = static_cast<unsigned int>(morphChannels.size());
                    morphAnim->mKeys[key].mValues = new unsigned int[morphChannels.size()];
                    morphAnim->mKeys[key].mWeights = new double[morphChannels.size()];

                    morphAnim->mKeys[key].mTime = morphTimeValues[key].mTime;
                    for (unsigned int valueIndex = 0; valueIndex < morphChannels.size(); valueIndex++)
                    {
                        morphAnim->mKeys[key].mValues[valueIndex] = valueIndex;
                        morphAnim->mKeys[key].mWeights[valueIndex] = getWeightAtKey(morphTimeValues, key, valueIndex);
                    }
                }

                morphAnims.push_back(morphAnim);
            }
        }
    }

    if (!anims.empty() || !morphAnims.empty())
    {
        aiAnimation* anim = new aiAnimation;
        anim->mName.Set(pName);
        anim->mNumChannels = static_cast<unsigned int>(anims.size());
        if (anim->mNumChannels > 0)
        {
            anim->mChannels = new aiNodeAnim*[anims.size()];
            std::copy(anims.begin(), anims.end(), anim->mChannels);
        }
        anim->mNumMorphMeshChannels = static_cast<unsigned int>(morphAnims.size());
        if (anim->mNumMorphMeshChannels > 0)
        {
            anim->mMorphMeshChannels = new aiMeshMorphAnim*[anim->mNumMorphMeshChannels];
            std::copy(morphAnims.begin(), morphAnims.end(), anim->mMorphMeshChannels);
        }
        anim->mDuration = 0.0f;
        for (size_t a = 0; a < anims.size(); ++a)
        {
            anim->mDuration = std::max(anim->mDuration, anims[a]->mPositionKeys[anims[a]->mNumPositionKeys - 1].mTime);
            anim->mDuration = std::max(anim->mDuration, anims[a]->mRotationKeys[anims[a]->mNumRotationKeys - 1].mTime);
            anim->mDuration = std::max(anim->mDuration, anims[a]->mScalingKeys[anims[a]->mNumScalingKeys - 1].mTime);
        }
        for (size_t a = 0; a < morphAnims.size(); ++a)
        {
            anim->mDuration = std::max(anim->mDuration, morphAnims[a]->mKeys[morphAnims[a]->mNumKeys - 1].mTime);
        }
        anim->mTicksPerSecond = 1;
        mAnims.push_back(anim);
    }
}